

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void kj::ArrayDisposer::Dispose_<capnp::_::RpcSystemBase::RpcConnectionState::Export>::destruct
               (void *ptr)

{
  void *ptr_local;
  
  dtor<capnp::_::RpcSystemBase::RpcConnectionState::Export>((Export *)ptr);
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }